

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketClient.cpp
# Opt level: O0

void __thiscall SocketClient::bytesWritten(SocketClient *this,SharedPtr *socket,uint64_t bytes)

{
  uint64_t local_28;
  uint64_t copy;
  uint64_t bytes_local;
  SharedPtr *socket_local;
  SocketClient *this_local;
  
  local_28 = bytes;
  copy = bytes;
  bytes_local = (uint64_t)socket;
  socket_local = (SharedPtr *)this;
  Signal<std::function<void(std::shared_ptr<SocketClient>const&,int)>>::operator()
            ((Signal<std::function<void(std::shared_ptr<SocketClient>const&,int)>> *)
             &this->mSignalBytesWritten,socket,&local_28);
  return;
}

Assistant:

void SocketClient::bytesWritten(const SocketClient::SharedPtr &socket, uint64_t bytes)
{
    const uint64_t copy = bytes;
#ifdef RCT_SOCKETCLIENT_TIMING_ENABLED
    List<TimeData>::iterator it = mPendingWrites.begin();
    while (bytes && it != mPendingWrites.end()) {
        if (it->add(bytes)) {
            mWrites.append(*it);
            it = mPendingWrites.erase(it);
        } else {
            ++it;
        }
    }
    assert(!bytes);
#endif
    mSignalBytesWritten(socket, copy);
}